

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_comparison_suite.cpp
# Opt level: O1

void equality_suite::compare_map_equal_boolean(void)

{
  bool bVar1;
  size_type sVar2;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_00;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_01;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_02;
  undefined1 local_da;
  undefined1 local_d9;
  type local_d8;
  undefined1 local_b8;
  type local_a8;
  undefined1 local_88;
  variable_type local_78;
  undefined4 local_48 [8];
  undefined1 local_28;
  
  trial::dynamic::basic_map<std::allocator<char>_>::make();
  local_b8 = 1;
  local_d8.__data[0] = '\0';
  local_a8.__data[0] =
       trial::dynamic::detail::
       operator_overloader<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_void>
       ::equal(&local_78,(variable_type *)&local_d8.__align);
  local_da = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make() == variable(false)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xdbd,"void equality_suite::compare_map_equal_boolean()",&local_a8,&local_da);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_d8.__align);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_78);
  trial::dynamic::basic_map<std::allocator<char>_>::make();
  local_b8 = 1;
  local_d8.__data[0] = '\0';
  bVar1 = trial::dynamic::detail::
          operator_overloader<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_void>
          ::equal(&local_78,(variable_type *)&local_d8.__align);
  local_a8.__data[0] = !bVar1;
  local_da = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make() != variable(false)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xdbe,"void equality_suite::compare_map_equal_boolean()",&local_a8,&local_da);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_d8.__align);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_78);
  trial::dynamic::basic_map<std::allocator<char>_>::make();
  local_b8 = 1;
  local_d8.__data[0] = '\x01';
  local_a8.__data[0] =
       trial::dynamic::detail::
       operator_overloader<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_void>
       ::equal(&local_78,(variable_type *)&local_d8.__align);
  local_da = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make() == variable(true)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xdbf,"void equality_suite::compare_map_equal_boolean()",&local_a8,&local_da);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_d8.__align);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_78);
  trial::dynamic::basic_map<std::allocator<char>_>::make();
  local_b8 = 1;
  local_d8.__data[0] = '\x01';
  bVar1 = trial::dynamic::detail::
          operator_overloader<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_void>
          ::equal(&local_78,(variable_type *)&local_d8.__align);
  local_a8.__data[0] = !bVar1;
  local_da = 1;
  sVar2 = 0xdc0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make() != variable(true)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xdc0,"void equality_suite::compare_map_equal_boolean()",&local_a8,&local_da);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_d8.__align);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_78);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_78,"alpha");
  local_28 = 6;
  local_48[0] = 1;
  init._M_len = sVar2;
  init._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)&local_d8.__align,
             (basic_map<std::allocator<char>_> *)&local_78,init);
  local_88 = 1;
  local_a8.__data[0] = '\0';
  local_da = trial::dynamic::detail::
             operator_overloader<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_void>
             ::equal((variable_type *)&local_d8.__align,(variable_type *)&local_a8.__align);
  local_d9 = 0;
  sVar2 = 0xdc2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make({ {\"alpha\", 1} }) == variable(false)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xdc2,"void equality_suite::compare_map_equal_boolean()",&local_da,&local_d9);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_a8.__align);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_d8.__align);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)local_48);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_78);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_78,"alpha");
  local_28 = 6;
  local_48[0] = 1;
  init_00._M_len = sVar2;
  init_00._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)&local_d8.__align,
             (basic_map<std::allocator<char>_> *)&local_78,init_00);
  local_88 = 1;
  local_a8.__data[0] = '\0';
  bVar1 = trial::dynamic::detail::
          operator_overloader<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_void>
          ::equal((variable_type *)&local_d8.__align,(variable_type *)&local_a8.__align);
  local_da = !bVar1;
  local_d9 = 1;
  sVar2 = 0xdc3;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make({ {\"alpha\", 1} }) != variable(false)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xdc3,"void equality_suite::compare_map_equal_boolean()",&local_da,&local_d9);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_a8.__align);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_d8.__align);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)local_48);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_78);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_78,"alpha");
  local_28 = 6;
  local_48[0] = 1;
  init_01._M_len = sVar2;
  init_01._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)&local_d8.__align,
             (basic_map<std::allocator<char>_> *)&local_78,init_01);
  local_88 = 1;
  local_a8.__data[0] = '\x01';
  local_da = trial::dynamic::detail::
             operator_overloader<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_void>
             ::equal((variable_type *)&local_d8.__align,(variable_type *)&local_a8.__align);
  local_d9 = 0;
  sVar2 = 0xdc4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make({ {\"alpha\", 1} }) == variable(true)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xdc4,"void equality_suite::compare_map_equal_boolean()",&local_da,&local_d9);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_a8.__align);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_d8.__align);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)local_48);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_78);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_78,"alpha");
  local_28 = 6;
  local_48[0] = 1;
  init_02._M_len = sVar2;
  init_02._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)&local_d8.__align,
             (basic_map<std::allocator<char>_> *)&local_78,init_02);
  local_88 = 1;
  local_a8.__data[0] = '\x01';
  bVar1 = trial::dynamic::detail::
          operator_overloader<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_void>
          ::equal((variable_type *)&local_d8.__align,(variable_type *)&local_a8.__align);
  local_da = !bVar1;
  local_d9 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make({ {\"alpha\", 1} }) != variable(true)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xdc5,"void equality_suite::compare_map_equal_boolean()",&local_da,&local_d9);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_a8.__align);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_d8.__align);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)local_48);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_78);
  return;
}

Assistant:

void compare_map_equal_boolean()
{
    TRIAL_PROTOCOL_TEST_EQUAL(map::make() == variable(false), false);
    TRIAL_PROTOCOL_TEST_EQUAL(map::make() != variable(false), true);
    TRIAL_PROTOCOL_TEST_EQUAL(map::make() == variable(true), false);
    TRIAL_PROTOCOL_TEST_EQUAL(map::make() != variable(true), true);

    TRIAL_PROTOCOL_TEST_EQUAL(map::make({ {"alpha", 1} }) == variable(false), false);
    TRIAL_PROTOCOL_TEST_EQUAL(map::make({ {"alpha", 1} }) != variable(false), true);
    TRIAL_PROTOCOL_TEST_EQUAL(map::make({ {"alpha", 1} }) == variable(true), false);
    TRIAL_PROTOCOL_TEST_EQUAL(map::make({ {"alpha", 1} }) != variable(true), true);
}